

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perceptron.cpp
# Opt level: O3

void __thiscall PyreNet::Perceptron::mutate_uniform(Perceptron *this,double lower,double upper)

{
  double *pdVar1;
  RandomGenerator *this_00;
  double *weight;
  double *pdVar2;
  double dVar3;
  
  this_00 = RandomGenerator::getInstance();
  pdVar1 = (this->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar2 = (this->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    dVar3 = RandomGenerator::generate_uniform(this_00,lower,upper);
    *pdVar2 = dVar3 + *pdVar2;
  }
  return;
}

Assistant:

void Perceptron::mutate_uniform(const double lower, const double upper) {
        RandomGenerator *randomGenerator = RandomGenerator::getInstance();
        for (double &weight : this->weights) {
            weight += randomGenerator->generate_uniform(lower, upper);
        }
    }